

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocketPrivate::QSslSocketPrivate(QSslSocketPrivate *this)

{
  TlsCryptograph *pTVar1;
  QTlsBackend *pQVar2;
  TlsCryptograph *pTVar3;
  QLoggingCategory *pQVar4;
  QDebug *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QDebug local_50;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTcpSocketPrivate::QTcpSocketPrivate(&this->super_QTcpSocketPrivate);
  *(undefined ***)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate =
       &PTR__QSslSocketPrivate_002cfb58;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.super_QAbstractSocketEngineReceiver.
  _vptr_QAbstractSocketEngineReceiver = (_func_int **)&PTR__QSslSocketPrivate_002cfbf8;
  *(undefined8 *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 0;
  (this->ignoreErrorsList).d.d = (Data *)0x0;
  (this->ignoreErrorsList).d.ptr = (QSslError *)0x0;
  (this->ignoreErrorsList).d.size = 0;
  this->readyReadEmittedPointer = (bool *)0x0;
  QSslConfigurationPrivate::QSslConfigurationPrivate(&this->configuration);
  (this->verificationPeerName).d.d = (Data *)0x0;
  (this->verificationPeerName).d.ptr = (char16_t *)0x0;
  (this->verificationPeerName).d.size = 0;
  this->allowRootCertOnDemandLoading = true;
  this->plainSocket = (QTcpSocket *)0x0;
  this->paused = false;
  this->flushTriggered = false;
  (this->backend)._M_t.
  super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  ._M_t.
  super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
  .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl = (TlsCryptograph *)0x0;
  QSslConfigurationPrivate::deepCopyDefaultConfiguration(&this->configuration);
  if ((this->configuration).allowRootCertOnDemandLoading == false) {
    this->allowRootCertOnDemandLoading = false;
  }
  pQVar2 = tlsBackendInUse();
  if (pQVar2 == (QTlsBackend *)0x0) {
    pQVar4 = QtPrivateLogging::lcSsl();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_30 = pQVar4->name;
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      QMessageLogger::warning(local_48,"No TLS backend is available");
    }
  }
  else {
    pTVar3 = (TlsCryptograph *)(**(code **)(*(long *)pQVar2 + 200))(pQVar2);
    pTVar1 = (this->backend)._M_t.
             super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             ._M_t.
             super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
    (this->backend)._M_t.
    super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
    ._M_t.
    super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
    .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl = pTVar3;
    if (pTVar1 != (TlsCryptograph *)0x0) {
      (**(code **)(*(long *)pTVar1 + 0x20))();
      pTVar3 = (this->backend)._M_t.
               super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               ._M_t.
               super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
               .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
    }
    if (pTVar3 == (TlsCryptograph *)0x0) {
      pQVar4 = QtPrivateLogging::lcSsl();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_30 = pQVar4->name;
        local_48[0] = '\x02';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        QMessageLogger::warning();
        pQVar5 = QDebug::operator<<(&local_50,"The backend named");
        (**(code **)(*(long *)pQVar2 + 0x90))(&QStack_68,pQVar2);
        pQVar5 = QDebug::operator<<(pQVar5,(QString *)&QStack_68);
        QDebug::operator<<(pQVar5,"does not support TLS");
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
        QDebug::~QDebug(&local_50);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslSocketPrivate::QSslSocketPrivate()
    : initialized(false)
    , mode(QSslSocket::UnencryptedMode)
    , autoStartHandshake(false)
    , connectionEncrypted(false)
    , ignoreAllSslErrors(false)
    , readyReadEmittedPointer(nullptr)
    , allowRootCertOnDemandLoading(true)
    , plainSocket(nullptr)
    , paused(false)
    , flushTriggered(false)
{
    QSslConfigurationPrivate::deepCopyDefaultConfiguration(&configuration);
    // If the global configuration doesn't allow root certificates to be loaded
    // on demand then we have to disable it for this socket as well.
    if (!configuration.allowRootCertOnDemandLoading)
        allowRootCertOnDemandLoading = false;

    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return;
    }
    backend.reset(tlsBackend->createTlsCryptograph());
    if (!backend.get()) {
        qCWarning(lcSsl) << "The backend named" << tlsBackend->backendName()
                         << "does not support TLS";
    }
}